

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<int>::genFixeds
          (DefaultSampling<int> *this,FloatFormat *param_1,vector<int,_std::allocator<int>_> *dst)

{
  iterator iVar1;
  int local_14 [3];
  
  local_14[2] = 0;
  iVar1._M_current =
       (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar1,local_14 + 2);
  }
  else {
    *iVar1._M_current = 0;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  local_14[1] = 0xffffffff;
  iVar1._M_current =
       (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar1,local_14 + 1);
  }
  else {
    *iVar1._M_current = -1;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  local_14[0] = 1;
  iVar1._M_current =
       (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(dst,iVar1,local_14);
  }
  else {
    *iVar1._M_current = 1;
    (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar1._M_current + 1;
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat&, vector<int>& dst) const
	{
		dst.push_back(0);
		dst.push_back(-1);
		dst.push_back(1);
	}